

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

node_t find_maximum(flags_map_t *f)

{
  int iVar1;
  node_t nVar2;
  unsigned_long uVar3;
  size_t sVar4;
  size_type sVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  pair<int,_int> local_38;
  unsigned_long local_30;
  size_t j;
  size_t i;
  flags_map_t *local_18;
  flags_map_t *f_local;
  node_t result;
  
  i._4_4_ = 0;
  i._0_4_ = 0;
  local_18 = f;
  std::pair<int,_int>::pair<int,_int,_true>
            ((pair<int,_int> *)&f_local,(int *)((long)&i + 4),(int *)&i);
  j = 0;
  while( true ) {
    sVar4 = j;
    sVar5 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(f);
    if (sVar5 <= sVar4) break;
    local_30 = 0;
    while( true ) {
      uVar3 = local_30;
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](f,j);
      sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar6);
      if (sVar5 <= uVar3) break;
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](f,j);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,local_30);
      iVar1 = *pvVar7;
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](f,(long)(int)f_local);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar6,(long)f_local._4_4_);
      if (*pvVar7 < iVar1) {
        std::pair<int,_int>::pair<unsigned_long_&,_unsigned_long_&,_true>(&local_38,&j,&local_30);
        std::pair<int,_int>::operator=((pair<int,_int> *)&f_local,&local_38);
      }
      local_30 = local_30 + 1;
    }
    j = j + 1;
  }
  nVar2.second = f_local._4_4_;
  nVar2.first = (int)f_local;
  return nVar2;
}

Assistant:

node_t find_maximum(const flags_map_t f)
{
    node_t result(0, 0);
    for (size_t i = 0; i < f.size(); i++)
    {
        for (size_t j = 0; j < f[i].size(); j++)
        {
            if (f[i][j] > f[result.first][result.second])
            {
                result = node_t(i, j);
            }
        }
    }

    return result;
}